

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O1

bool Cipher::normalizeSimilarityMap
               (TParameters *param_1,TSimilarityMap *ccMap,TSimilarityMap *logMap,
               TSimilarityMap *logMapInv)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  pointer pvVar4;
  long lVar5;
  int i;
  ulong uVar6;
  double *pdVar7;
  ulong uVar8;
  int i_1;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  pvVar4 = (ccMap->
           super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (int)((long)(ccMap->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) * -0x55555555
  ;
  if ((int)uVar2 < 2) {
    dVar9 = 1e-06;
    dVar11 = 1.79769313486232e+308;
  }
  else {
    dVar11 = 1.79769313486232e+308;
    dVar9 = 2.2250738585072014e-308;
    uVar3 = 1;
    lVar5 = 0x10;
    uVar8 = 0;
    do {
      uVar6 = uVar8 + 1;
      pdVar7 = (double *)
               (*(long *)&pvVar4[uVar8].super__Vector_base<stMatch,_std::allocator<stMatch>_>.
                          _M_impl.super__Vector_impl_data + lVar5);
      uVar8 = (ulong)(uVar2 & 0x7fffffff);
      dVar10 = dVar9;
      dVar12 = dVar11;
      do {
        dVar9 = *pdVar7;
        dVar11 = dVar9;
        if (dVar12 <= dVar9) {
          dVar11 = dVar12;
        }
        if (dVar9 <= dVar10) {
          dVar9 = dVar10;
        }
        pdVar7 = pdVar7 + 2;
        uVar8 = uVar8 - 1;
        dVar10 = dVar9;
        dVar12 = dVar11;
      } while (uVar3 != uVar8);
      uVar3 = uVar3 + 1;
      lVar5 = lVar5 + 0x10;
      uVar8 = uVar6;
    } while (uVar6 != uVar2 - 1);
    dVar11 = dVar11 + -1e-06;
    dVar9 = dVar9 + 1e-06;
  }
  printf("ccMax = %g, ccMin = %g\n");
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      pvVar4 = (ccMap->
               super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar8;
      lVar5 = 0;
      uVar3 = 0;
      do {
        if (uVar8 == uVar3) {
          *(undefined8 *)
           (*(long *)&(pvVar4->super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                      super__Vector_impl_data + lVar5) = 0x3ff0000000000000;
        }
        else {
          lVar1 = *(long *)&(pvVar4->super__Vector_base<stMatch,_std::allocator<stMatch>_>)._M_impl.
                            super__Vector_impl_data;
          *(double *)(lVar1 + lVar5) = (*(double *)(lVar1 + lVar5) - dVar11) / (dVar9 - dVar11);
        }
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 0x10;
      } while ((uVar2 & 0x7fffffff) != uVar3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar2 & 0x7fffffff));
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMap,ccMap);
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      lVar5 = 0;
      uVar3 = 0;
      do {
        lVar1 = *(long *)&(logMap->
                          super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar8].
                          super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                          super__Vector_impl_data;
        dVar9 = 0.0;
        if (uVar8 != uVar3) {
          dVar9 = log(*(double *)(lVar1 + lVar5));
        }
        *(double *)(lVar1 + lVar5) = dVar9;
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 0x10;
      } while ((uVar2 & 0x7fffffff) != uVar3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar2 & 0x7fffffff));
  }
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(logMapInv,ccMap);
  if (0 < (int)uVar2) {
    uVar8 = 0;
    do {
      lVar5 = 0;
      uVar3 = 0;
      do {
        if (uVar8 == uVar3) {
          *(undefined8 *)
           (*(long *)&(logMap->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[uVar8].
                      super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                      super__Vector_impl_data + lVar5) = 0xc12e848000000000;
        }
        else {
          lVar1 = *(long *)&(logMapInv->
                            super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8].
                            super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                            super__Vector_impl_data;
          dVar9 = log(1.0 - *(double *)(lVar1 + lVar5));
          *(double *)(lVar1 + lVar5) = dVar9;
        }
        uVar3 = uVar3 + 1;
        lVar5 = lVar5 + 0x10;
      } while ((uVar2 & 0x7fffffff) != uVar3);
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uVar2 & 0x7fffffff));
  }
  return true;
}

Assistant:

bool normalizeSimilarityMap(
            const TParameters & ,
            TSimilarityMap & ccMap,
            TSimilarityMap & logMap,
            TSimilarityMap & logMapInv) {
        int n = ccMap.size();

        double ccMin = std::numeric_limits<double>::max();
        double ccMax = std::numeric_limits<double>::min();

        for (int j = 0; j < n - 1; ++j) {
            for (int i = j + 1; i < n; ++i) {
                ccMin = std::min(ccMin, ccMap[j][i].cc);
                ccMax = std::max(ccMax, ccMap[j][i].cc);
            }
        }

        ccMin -= 1e-6;
        ccMax += 1e-6;

        printf("ccMax = %g, ccMin = %g\n", ccMax, ccMin);

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    ccMap[j][i].cc = 1.0;
                    continue;
                }

                auto & v = ccMap[j][i].cc;
                v = (v - ccMin)/(ccMax - ccMin);
                //v = 1.0 - std::exp(-1.1f*v);
            }
        }

        logMap = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = 0.0;
                    continue;
                }

                auto & v = logMap[j][i].cc;
                v = std::log(v);
            }
        }

        logMapInv = ccMap;

        for (int j = 0; j < n; ++j) {
            for (int i = 0; i < n; ++i) {
                if (i == j) {
                    logMap[j][i].cc = -1e6;
                    continue;
                }

                auto & v = logMapInv[j][i].cc;
                v = std::log(1.0 - v);
            }
        }

        return true;
    }